

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow *pIVar4;
  bool bVar5;
  
  pIVar1 = GImGui->NavWindow;
  if (pIVar1 == (ImGuiWindow *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = true;
    if ((flags & 4U) == 0) {
      pIVar2 = GImGui->CurrentWindow;
      if ((flags & 2U) != 0) {
        pIVar3 = pIVar2;
        if (pIVar2 == (ImGuiWindow *)0x0) {
          pIVar2 = (ImGuiWindow *)0x0;
        }
        else {
          do {
            pIVar2 = pIVar3;
            pIVar3 = pIVar2->RootWindow;
            if ((flags & 8U) == 0) {
              pIVar3 = pIVar3->RootWindowPopupTree;
            }
          } while (pIVar2 != pIVar3);
        }
      }
      pIVar3 = pIVar1;
      if ((flags & 1U) == 0) {
        return pIVar1 == pIVar2;
      }
      do {
        pIVar4 = pIVar3;
        pIVar3 = pIVar4->RootWindow;
        if ((flags & 8U) == 0) {
          pIVar3 = pIVar3->RootWindowPopupTree;
        }
      } while (pIVar4 != pIVar3);
      if (pIVar4 != pIVar2) {
        do {
          bVar5 = pIVar1 == pIVar2;
          if (bVar5) {
            return bVar5;
          }
          if (pIVar1 == pIVar4) {
            return bVar5;
          }
          pIVar1 = pIVar1->ParentWindow;
        } while (pIVar1 != (ImGuiWindow *)0x0);
      }
    }
  }
  return bVar5;
}

Assistant:

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* ref_window = g.NavWindow;
    ImGuiWindow* cur_window = g.CurrentWindow;

    if (ref_window == NULL)
        return false;
    if (flags & ImGuiFocusedFlags_AnyWindow)
        return true;

    IM_ASSERT(cur_window); // Not inside a Begin()/End()
    const bool popup_hierarchy = (flags & ImGuiFocusedFlags_NoPopupHierarchy) == 0;
    if (flags & ImGuiHoveredFlags_RootWindow)
        cur_window = GetCombinedRootWindow(cur_window, popup_hierarchy);

    if (flags & ImGuiHoveredFlags_ChildWindows)
        return IsWindowChildOf(ref_window, cur_window, popup_hierarchy);
    else
        return (ref_window == cur_window);
}